

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O2

void If_ManImproveNodeFaninUpdate(If_Man_t *p,If_Obj_t *pObj,Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  If_Obj_t *pIVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (((undefined1  [112])*pObj & (undefined1  [112])0xf) != (undefined1  [112])0x4) {
    __assert_fail("If_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifReduce.c"
                  ,0x13c,
                  "void If_ManImproveNodeFaninUpdate(If_Man_t *, If_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  uVar1 = vFront->nSize;
  uVar4 = (ulong)uVar1;
  do {
    if ((int)uVar4 < 1) {
      __assert_fail("i >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                    ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
    }
    uVar5 = uVar4 - 1;
    lVar3 = uVar4 - 1;
    uVar4 = uVar5;
  } while ((If_Obj_t *)vFront->pArray[lVar3] != pObj);
  while (uVar4 = uVar5 + 1, (int)uVar4 < (int)uVar1) {
    vFront->pArray[uVar5] = vFront->pArray[uVar4];
    uVar5 = uVar4;
  }
  vFront->nSize = uVar1 - 1;
  pIVar2 = pObj->pFanin0;
  if ((pIVar2->field_0x1 & 1) == 0) {
    Vec_PtrPush(vFront,pIVar2);
    Vec_PtrPush(vVisited,pIVar2);
    pIVar2->field_0x1 = pIVar2->field_0x1 | 1;
  }
  pIVar2 = pObj->pFanin1;
  if ((pIVar2->field_0x1 & 1) == 0) {
    Vec_PtrPush(vFront,pIVar2);
    Vec_PtrPush(vVisited,pIVar2);
    pIVar2->field_0x1 = pIVar2->field_0x1 | 1;
  }
  return;
}

Assistant:

void If_ManImproveNodeFaninUpdate( If_Man_t * p, If_Obj_t * pObj, Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited )
{
    If_Obj_t * pFanin;
    assert( If_ObjIsAnd(pObj) );
    Vec_PtrRemove( vFront, pObj );
    pFanin = If_ObjFanin0(pObj);
    if ( !pFanin->fMark )
    {
        Vec_PtrPush( vFront, pFanin );
        Vec_PtrPush( vVisited, pFanin );
        pFanin->fMark = 1;
    }
    pFanin = If_ObjFanin1(pObj);
    if ( !pFanin->fMark )
    {
        Vec_PtrPush( vFront, pFanin );
        Vec_PtrPush( vVisited, pFanin );
        pFanin->fMark = 1;
    }
}